

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * soul::Value::createFromRawData
                  (Value *__return_storage_ptr__,Type *type,void *sourceData,size_t dataSize)

{
  size_t sVar1;
  size_t sVar2;
  void *__dest;
  Type local_48;
  undefined1 local_29;
  size_t local_28;
  size_t dataSize_local;
  void *sourceData_local;
  Type *type_local;
  Value *v;
  
  local_28 = dataSize;
  dataSize_local = (size_t)sourceData;
  sourceData_local = type;
  type_local = &__return_storage_ptr__->type;
  ignoreUnused<unsigned_long&>(&local_28);
  local_29 = 0;
  Type::Type(&local_48,type);
  Value(__return_storage_ptr__,&local_48);
  Type::~Type(&local_48);
  sVar1 = local_28;
  sVar2 = getPackedDataSize(__return_storage_ptr__);
  checkAssertion(sVar1 == sVar2,"dataSize == v.getPackedDataSize()","createFromRawData",0x217);
  __dest = getPackedData(__return_storage_ptr__);
  sVar1 = dataSize_local;
  sVar2 = getPackedDataSize(__return_storage_ptr__);
  memcpy(__dest,(void *)sVar1,sVar2);
  return __return_storage_ptr__;
}

Assistant:

Value Value::createFromRawData (Type type, const void* sourceData, size_t dataSize)
{
    ignoreUnused (dataSize);

    Value v (std::move (type));
    SOUL_ASSERT (dataSize == v.getPackedDataSize());
    memcpy (v.getPackedData(), sourceData, v.getPackedDataSize());
    return v;
}